

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

bool __thiscall
FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>
::hasFastAccess(FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>
                *this)

{
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
  *pFVar1;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>
  *pFVar2;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
  *pFVar3;
  
  pFVar1 = (this->left_->fadexpr_).left_;
  pFVar2 = (pFVar1->fadexpr_).left_;
  if ((((*(int *)(**(long **)(pFVar2->fadexpr_).left_ + 0x28) != 0) &&
       ((((pFVar2->fadexpr_).right_)->dx_).num_elts != 0)) &&
      ((((pFVar1->fadexpr_).right_)->dx_).num_elts != 0)) &&
     (pFVar3 = (this->right_->fadexpr_).left_,
     (((((pFVar3->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts != 0)) {
    return (((pFVar3->fadexpr_).right_)->dx_).num_elts != 0;
  }
  return false;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}